

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBasisToolsBspline.h
# Opt level: O3

void chrono::geometry::ChBasisToolsBspline::ComputeKnotUniformMultipleEnds
               (ChVectorDynamic<> *knotU,int p,double kstart,double kend)

{
  ulong uVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  ChException *this;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  undefined8 in_XMM0_Qb;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 in_XMM5_Qb;
  string local_40;
  
  uVar1 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  if ((long)uVar1 < (long)(p * 2 + 2)) {
    this = (ChException *)__cxa_allocate_exception(0x28);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,
               "ComputeKnotUniformMultipleEnds: knots must have size>=2*(order+1)","");
    ChException::ChException(this,&local_40);
    __cxa_throw(this,&ChException::typeinfo,ChException::~ChException);
  }
  iVar5 = (int)uVar1;
  uVar4 = iVar5 + p * -2;
  if (uVar4 != 0 && SBORROW4(iVar5,p * 2) == (int)uVar4 < 0) {
    uVar6 = 0;
    pdVar2 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    do {
      if ((p < 0) || ((long)uVar1 <= (long)((long)p + uVar6))) goto LAB_005eaa7d;
      auVar8._0_8_ = (double)(int)uVar6 / (double)(int)(uVar4 - 1);
      auVar8._8_8_ = in_XMM5_Qb;
      auVar3._8_8_ = in_XMM0_Qb;
      auVar3._0_8_ = kstart;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = kend - kstart;
      auVar3 = vfmadd213sd_fma(auVar8,auVar7,auVar3);
      pdVar2[(long)p + uVar6] = auVar3._0_8_;
      uVar6 = uVar6 + 1;
    } while (uVar4 != uVar6);
  }
  if (0 < p) {
    pdVar2 = (knotU->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    uVar6 = 0;
    do {
      iVar5 = iVar5 + -1;
      if ((((~((long)uVar1 >> 0x3f) & uVar1) == uVar6) || (pdVar2[uVar6] = kstart, iVar5 < 0)) ||
         (uVar1 <= (ulong)(long)iVar5)) {
LAB_005eaa7d:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      uVar6 = uVar6 + 1;
      pdVar2[iVar5] = kend;
    } while ((uint)p != uVar6);
  }
  return;
}

Assistant:

static void ComputeKnotUniformMultipleEnds(ChVectorDynamic<>& knotU,  ///< knot vector
                                               const int p,               ///< order
                                               double kstart = 0.0,       ///< range start
                                               double kend = 1.0          ///< range end
    ) {
        if (knotU.size() < 2 * (p + 1))
            throw ChException("ComputeKnotUniformMultipleEnds: knots must have size>=2*(order+1)");

        int k = (int)knotU.size();
        // intermediate knots:
        int nik = k - 2 * p;
        for (int i = 0; i < nik; ++i) {
            knotU(p + i) = kstart + (double(i) / double(nik - 1)) * (kend - kstart);
        }
        // initial and final multiple knots:
        for (int i = 0; i < p; ++i) {
            knotU(i) = kstart;
            knotU(k - i - 1) = kend;
        }
    }